

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeCloseStatement(Vdbe *p,int eOp)

{
  long lVar1;
  int op;
  int in_ESI;
  long *in_RDI;
  sqlite3 *unaff_retaddr;
  Btree *pBt;
  int rc2;
  int iSavepoint;
  int i;
  int rc;
  sqlite3 *db;
  int iVar2;
  int iVar3;
  int iVar4;
  
  lVar1 = *in_RDI;
  iVar4 = 0;
  op = (int)in_RDI[8] + -1;
  for (iVar3 = 0; iVar3 < *(int *)(lVar1 + 0x28); iVar3 = iVar3 + 1) {
    iVar2 = 0;
    if (*(long *)(*(long *)(lVar1 + 0x20) + (long)iVar3 * 0x20 + 8) != 0) {
      if (in_ESI == 2) {
        iVar2 = sqlite3BtreeSavepoint((Btree *)CONCAT44(iVar4,iVar3),op,0);
      }
      if (iVar2 == 0) {
        iVar2 = sqlite3BtreeSavepoint((Btree *)CONCAT44(iVar4,iVar3),op,0);
      }
      if (iVar4 == 0) {
        iVar4 = iVar2;
      }
    }
  }
  *(int *)(lVar1 + 0x2ec) = *(int *)(lVar1 + 0x2ec) + -1;
  *(undefined4 *)(in_RDI + 8) = 0;
  if (iVar4 == 0) {
    if (in_ESI == 2) {
      iVar4 = sqlite3VtabSavepoint(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    if (iVar4 == 0) {
      iVar4 = sqlite3VtabSavepoint(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
  }
  if (in_ESI == 2) {
    *(long *)(lVar1 + 0x2f0) = in_RDI[0xb];
    *(long *)(lVar1 + 0x2f8) = in_RDI[0xc];
  }
  return iVar4;
}

Assistant:

static SQLITE_NOINLINE int vdbeCloseStatement(Vdbe *p, int eOp){
  sqlite3 *const db = p->db;
  int rc = SQLITE_OK;
  int i;
  const int iSavepoint = p->iStatement-1;

  assert( eOp==SAVEPOINT_ROLLBACK || eOp==SAVEPOINT_RELEASE);
  assert( db->nStatement>0 );
  assert( p->iStatement==(db->nStatement+db->nSavepoint) );

  for(i=0; i<db->nDb; i++){
    int rc2 = SQLITE_OK;
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      if( eOp==SAVEPOINT_ROLLBACK ){
        rc2 = sqlite3BtreeSavepoint(pBt, SAVEPOINT_ROLLBACK, iSavepoint);
      }
      if( rc2==SQLITE_OK ){
        rc2 = sqlite3BtreeSavepoint(pBt, SAVEPOINT_RELEASE, iSavepoint);
      }
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
  }
  db->nStatement--;
  p->iStatement = 0;

  if( rc==SQLITE_OK ){
    if( eOp==SAVEPOINT_ROLLBACK ){
      rc = sqlite3VtabSavepoint(db, SAVEPOINT_ROLLBACK, iSavepoint);
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3VtabSavepoint(db, SAVEPOINT_RELEASE, iSavepoint);
    }
  }

  /* If the statement transaction is being rolled back, also restore the
  ** database handles deferred constraint counter to the value it had when
  ** the statement transaction was opened.  */
  if( eOp==SAVEPOINT_ROLLBACK ){
    db->nDeferredCons = p->nStmtDefCons;
    db->nDeferredImmCons = p->nStmtDefImmCons;
  }
  return rc;
}